

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O0

bool __thiscall ElfRelocator::exportSymbols(ElfRelocator *this)

{
  bool bVar1;
  reference pEVar2;
  element_type *peVar3;
  pointer pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string local_168;
  Identifier local_148;
  undefined1 local_128 [8];
  RelocationData data;
  string local_f8;
  Identifier local_d8;
  undefined1 local_b8 [72];
  string lowered;
  ElfRelocatorSymbol *sym;
  iterator __end2;
  iterator __begin2;
  vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_> *__range2;
  ElfRelocatorFile *file;
  iterator __end1;
  iterator __begin1;
  vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_> *__range1;
  bool error;
  ElfRelocator *this_local;
  
  __range1._7_1_ = 0;
  __end1 = std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>::begin(&this->files);
  file = (ElfRelocatorFile *)
         std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>::end(&this->files);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
                                     *)&file), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
             ::operator*(&__end1);
    __end2 = std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>::begin
                       (&pEVar2->symbols);
    sym = (ElfRelocatorSymbol *)
          std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>::end
                    (&pEVar2->symbols);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
                                       *)&sym), bVar1) {
      lowered.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
           ::operator*(&__end2);
      bVar1 = std::operator!=((shared_ptr<Label> *)lowered.field_2._8_8_,(nullptr_t)0x0);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)(local_b8 + 0x40),(string *)(lowered.field_2._8_8_ + 0x10));
        local_b8._56_8_ = std::__cxx11::string::begin();
        local_b8._48_8_ = std::__cxx11::string::end();
        local_b8._40_8_ = std::__cxx11::string::begin();
        local_b8._16_8_ =
             std::
             transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_b8._56_8_,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_b8._48_8_,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_b8._40_8_,tolower);
        std::__cxx11::string::string((string *)&local_f8,(string *)(local_b8 + 0x40));
        Identifier::Identifier(&local_d8,&local_f8);
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffff;
        SymbolTable::getLabel
                  ((SymbolTable *)local_b8,(Identifier *)&Global.symbolTable,(int)&local_d8,-1);
        std::shared_ptr<Label>::operator=
                  ((shared_ptr<Label> *)lowered.field_2._8_8_,(shared_ptr<Label> *)local_b8);
        std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)local_b8);
        Identifier::~Identifier(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        bVar1 = std::operator==((shared_ptr<Label> *)lowered.field_2._8_8_,(nullptr_t)0x0);
        if (bVar1) {
          Logger::printError<std::__cxx11::string>
                    ((Logger *)0x1,0x21f34d,(char *)(lowered.field_2._8_8_ + 0x10),args);
          __range1._7_1_ = 1;
          data.targetSymbolInfo = 5;
        }
        else {
          peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)lowered.field_2._8_8_);
          bVar1 = Label::isDefined(peVar3);
          if (bVar1) {
            Logger::printError<std::__cxx11::string>
                      ((Logger *)0x1,0x228cc3,(char *)(lowered.field_2._8_8_ + 0x10),args);
            __range1._7_1_ = 1;
            data.targetSymbolInfo = 5;
          }
          else {
            data._16_8_ = *(undefined8 *)(lowered.field_2._8_8_ + 0x30);
            pIVar4 = std::unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_>::operator->
                               (&this->relocator);
            (*pIVar4->_vptr_IElfRelocator[6])
                      (pIVar4,local_128,*(undefined8 *)(lowered.field_2._8_8_ + 0x30),
                       (ulong)*(uint *)(lowered.field_2._8_8_ + 0x50));
            *(undefined8 *)(lowered.field_2._8_8_ + 0x30) = data._16_8_;
            peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)lowered.field_2._8_8_);
            Label::setInfo(peVar3,data.symbolAddress._4_4_);
            peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)lowered.field_2._8_8_);
            Label::setIsData(peVar3,*(int *)(lowered.field_2._8_8_ + 0x50) == 1);
            peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)lowered.field_2._8_8_);
            Label::setUpdateInfo(peVar3,false);
            peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)lowered.field_2._8_8_);
            Label::setValue(peVar3,0);
            peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)lowered.field_2._8_8_);
            Label::setDefined(peVar3,true);
            peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)lowered.field_2._8_8_);
            std::__cxx11::string::string
                      ((string *)&local_168,(string *)(lowered.field_2._8_8_ + 0x10));
            Identifier::Identifier(&local_148,&local_168);
            Label::setOriginalName(peVar3,&local_148);
            Identifier::~Identifier(&local_148);
            std::__cxx11::string::~string((string *)&local_168);
            data.targetSymbolInfo = 0;
          }
        }
        std::__cxx11::string::~string((string *)(local_b8 + 0x40));
      }
      __gnu_cxx::
      __normal_iterator<ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<ElfRelocatorFile_*,_std::vector<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>_>
    ::operator++(&__end1);
  }
  return (bool)((__range1._7_1_ ^ 0xff) & 1);
}

Assistant:

bool ElfRelocator::exportSymbols()
{
	bool error = false;

	for (ElfRelocatorFile& file: files)
	{
		for (ElfRelocatorSymbol& sym: file.symbols)
		{
			if (sym.label != nullptr)
				continue;

			std::string lowered = sym.name;
			std::transform(lowered.begin(), lowered.end(), lowered.begin(), ::tolower);

			sym.label = Global.symbolTable.getLabel(Identifier(lowered),-1,-1);
			if (sym.label == nullptr)
			{
				Logger::printError(Logger::Error, "Invalid label name \"%s\"",sym.name);
				error = true;
				continue;
			}

			if (sym.label->isDefined())
			{
				Logger::printError(Logger::Error, "Label \"%s\" already defined",sym.name);
				error = true;
				continue;
			}

			RelocationData data;
			data.symbolAddress = sym.relativeAddress;
			relocator->setSymbolAddress(data,sym.relativeAddress,sym.type);

			sym.relativeAddress = data.symbolAddress;
			sym.label->setInfo(data.targetSymbolInfo);
			sym.label->setIsData(sym.type == STT_OBJECT);
			sym.label->setUpdateInfo(false);

			sym.label->setValue(0);
			sym.label->setDefined(true);
			sym.label->setOriginalName(Identifier(sym.name));
		}
	}

	return !error;
}